

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O1

void helper_palignr_xmm_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s,int32_t shift)

{
  uint uVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint64_t uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  
  if (shift < 0x20) {
    uVar1 = shift * 8;
    uVar9 = shift * 8 + 0x3f;
    bVar2 = (byte)uVar1;
    if (uVar9 < 0x7f) {
      if (shift << 3 < 1) {
        uVar7 = s->_q_ZMMReg[0] << (-bVar2 & 0x3f);
      }
      else {
        uVar7 = s->_q_ZMMReg[0] >> (bVar2 & 0x3f);
      }
    }
    else {
      uVar7 = 0;
    }
    if (uVar1 - 1 < 0x7f) {
      if ((int)uVar1 < 0x41) {
        uVar5 = s->_q_ZMMReg[1] << (-bVar2 & 0x3f);
      }
      else {
        uVar5 = s->_q_ZMMReg[1] >> (bVar2 - 0x40 & 0x3f);
      }
    }
    else {
      uVar5 = 0;
    }
    if (uVar1 - 0x41 < 0x7f) {
      if ((int)uVar1 < 0x81) {
        uVar12 = d->_q_ZMMReg[0] << (-bVar2 & 0x3f);
      }
      else {
        uVar12 = d->_q_ZMMReg[0] >> (bVar2 + 0x80 & 0x3f);
      }
    }
    else {
      uVar12 = 0;
    }
    if (uVar1 - 0x81 < 0x7f) {
      if ((int)uVar1 < 0xc1) {
        uVar11 = d->_q_ZMMReg[1] << (-bVar2 & 0x3f);
      }
      else {
        uVar11 = d->_q_ZMMReg[1] >> (bVar2 + 0x40 & 0x3f);
      }
    }
    else {
      uVar11 = 0;
    }
    if (uVar1 < 0xffffff81) {
      uVar10 = 0;
    }
    else if ((int)uVar1 < -0x3f) {
      uVar10 = s->_q_ZMMReg[0] << (-bVar2 & 0x3f);
    }
    else {
      uVar10 = s->_q_ZMMReg[0] >> (bVar2 + 0x40 & 0x3f);
    }
    if (uVar9 < 0x7f) {
      if (shift << 3 < 1) {
        uVar3 = s->_q_ZMMReg[1] << (-bVar2 & 0x3f);
      }
      else {
        uVar3 = s->_q_ZMMReg[1] >> (bVar2 & 0x3f);
      }
    }
    else {
      uVar3 = 0;
    }
    if (uVar1 - 1 < 0x7f) {
      if ((int)uVar1 < 0x41) {
        uVar8 = d->_q_ZMMReg[0] << (-bVar2 & 0x3f);
      }
      else {
        uVar8 = d->_q_ZMMReg[0] >> (bVar2 - 0x40 & 0x3f);
      }
    }
    else {
      uVar8 = 0;
    }
    if (uVar1 - 0x41 < 0x7f) {
      if ((int)uVar1 < 0x81) {
        uVar4 = d->_q_ZMMReg[1] << (-bVar2 & 0x3f);
      }
      else {
        uVar4 = d->_q_ZMMReg[1] >> (bVar2 + 0x80 & 0x3f);
      }
    }
    else {
      uVar4 = 0;
    }
    uVar4 = uVar3 | uVar10 | uVar8 | uVar4;
    uVar6 = uVar5 | uVar7 | uVar12 | uVar11;
  }
  else {
    uVar4 = 0;
    uVar6 = 0;
  }
  d->_q_ZMMReg[0] = uVar6;
  d->_q_ZMMReg[1] = uVar4;
  return;
}

Assistant:

void glue(helper_palignr, SUFFIX)(CPUX86State *env, Reg *d, Reg *s,
                                  int32_t shift)
{
    Reg r;

    /* XXX could be checked during translation */
    if (shift >= (16 << SHIFT)) {
        r.Q(0) = 0;
        XMM_ONLY(r.Q(1) = 0);
    } else {
        shift <<= 3;
#define SHR(v, i) (i < 64 && i > -64 ? i > 0 ? v >> (i) : (v << -(i)) : 0)
#if SHIFT == 0
        r.Q(0) = SHR(s->Q(0), shift - 0) |
            SHR(d->Q(0), shift -  64);
#else
        r.Q(0) = SHR(s->Q(0), shift - 0) |
            SHR(s->Q(1), shift -  64) |
            SHR(d->Q(0), shift - 128) |
            SHR(d->Q(1), shift - 192);
        r.Q(1) = SHR(s->Q(0), shift + 64) |
            SHR(s->Q(1), shift -   0) |
            SHR(d->Q(0), shift -  64) |
            SHR(d->Q(1), shift - 128);
#endif
#undef SHR
    }

    *d = r;
}